

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<unsigned_char,long_long>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_21;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1f;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1e;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1d;
  int local_1c [5];
  
  local_1c[4] = 3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_1d,local_1c + 4);
  if (local_1d.m_int != '\x02') {
    local_1c[3] = 4;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_1e,local_1c + 3);
    if (local_1e.m_int != '\x05') {
      local_1c[2] = 6;
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_1f,local_1c + 2);
      if (local_1f.m_int != '\a') {
        local_1c[1] = 1;
        SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_20,local_1c + 1);
        if (local_20.m_int == '\0') {
          local_1c[0] = 0;
          SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_21,local_1c);
          return local_21.m_int != '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}